

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse.h
# Opt level: O0

void FSE_initCState(FSE_CState_t *statePtr,FSE_CTable *ct)

{
  U16 UVar1;
  void *in_RSI;
  long *in_RDI;
  U32 tableLog;
  U16 *u16ptr;
  void *ptr;
  int local_34;
  
  UVar1 = MEM_read16(in_RSI);
  *in_RDI = 1L << ((byte)UVar1 & 0x3f);
  in_RDI[1] = (long)in_RSI + 4;
  if (UVar1 == 0) {
    local_34 = 1;
  }
  else {
    local_34 = 1 << ((byte)UVar1 - 1 & 0x1f);
  }
  in_RDI[2] = (long)in_RSI + (long)local_34 * 4 + 4;
  *(uint *)(in_RDI + 3) = (uint)UVar1;
  return;
}

Assistant:

MEM_STATIC void FSE_initCState(FSE_CState_t* statePtr, const FSE_CTable* ct)
{
    const void* ptr = ct;
    const U16* u16ptr = (const U16*) ptr;
    const U32 tableLog = MEM_read16(ptr);
    statePtr->value = (ptrdiff_t)1<<tableLog;
    statePtr->stateTable = u16ptr+2;
    statePtr->symbolTT = ((const U32*)ct + 1 + (tableLog ? (1<<(tableLog-1)) : 1));
    statePtr->stateLog = tableLog;
}